

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::MapTextureSubresource
          (DeviceContextGLImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 ArraySlice,
          MAP_TYPE MapType,MAP_FLAGS MapFlags,Box *pMapRegion,MappedTextureSubresource *MappedData)

{
  Uint32 *pUVar1;
  BufferGLImpl *this_00;
  int iVar2;
  undefined4 extraout_var;
  TextureDesc *TexDesc;
  Uint64 Offset;
  string msg;
  undefined1 local_60 [40];
  Uint64 local_38;
  undefined4 extraout_var_00;
  
  if (pTexture == (ITexture *)0x0) {
    FormatString<char[26]>((string *)local_60,(char (*) [26])0x35e4c2);
    DebugAssertionFailed
              ((Char *)local_60._0_8_,"MapTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x754);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  iVar2 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  ValidateMapTextureParams
            ((TextureDesc *)CONCAT44(extraout_var,iVar2),MipLevel,ArraySlice,MapType,(uint)MapFlags,
             pMapRegion);
  pUVar1 = &(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_Stats.CommandCounters.
            MapTextureSubresource;
  *pUVar1 = *pUVar1 + 1;
  CheckDynamicType<Diligent::TextureBaseGL,Diligent::ITexture>(pTexture);
  iVar2 = (*(pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pTexture);
  TexDesc = (TextureDesc *)CONCAT44(extraout_var_00,iVar2);
  if (TexDesc->Usage == USAGE_STAGING) {
    Offset = GetStagingTextureLocationOffset(TexDesc,ArraySlice,MipLevel,4,0,0,0);
    GetMipLevelProperties((MipLevelProperties *)local_60,TexDesc,MipLevel);
    this_00 = (BufferGLImpl *)pTexture[0x16].super_IDeviceObject.super_IObject._vptr_IObject;
    if (this_00 != (BufferGLImpl *)0x0) {
      CheckDynamicType<Diligent::BufferGLImpl,Diligent::IBuffer>((IBuffer *)this_00);
    }
    BufferGLImpl::MapRange
              (this_00,&this->m_ContextState,MapType,(uint)MapFlags,Offset,local_38,
               &MappedData->pData);
    MappedData->Stride = local_60._24_8_;
    MappedData->DepthStride = local_38;
  }
  else {
    FormatString<char[46]>
              ((string *)local_60,(char (*) [46])"Only staging textures can be mapped in OpenGL");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_60._0_8_,0,0,0);
    }
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    MappedData->pData = (PVoid)0x0;
    MappedData->Stride = 0;
    MappedData->DepthStride = 0;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::MapTextureSubresource(ITexture*                 pTexture,
                                                Uint32                    MipLevel,
                                                Uint32                    ArraySlice,
                                                MAP_TYPE                  MapType,
                                                MAP_FLAGS                 MapFlags,
                                                const Box*                pMapRegion,
                                                MappedTextureSubresource& MappedData)
{
    TDeviceContextBase::MapTextureSubresource(pTexture, MipLevel, ArraySlice, MapType, MapFlags, pMapRegion, MappedData);
    TextureBaseGL*     pTexGL  = ClassPtrCast<TextureBaseGL>(pTexture);
    const TextureDesc& TexDesc = pTexGL->GetDesc();
    if (TexDesc.Usage == USAGE_STAGING)
    {
        Uint64             PBOOffset       = GetStagingTextureSubresourceOffset(TexDesc, ArraySlice, MipLevel, TextureBaseGL::PBOOffsetAlignment);
        MipLevelProperties MipLevelAttribs = GetMipLevelProperties(TexDesc, MipLevel);
        BufferGLImpl*      pPBO            = ClassPtrCast<BufferGLImpl>(pTexGL->GetPBO());
        pPBO->MapRange(m_ContextState, MapType, MapFlags, PBOOffset, MipLevelAttribs.MipSize, MappedData.pData);

        MappedData.Stride      = MipLevelAttribs.RowSize;
        MappedData.DepthStride = MipLevelAttribs.MipSize;
    }
    else
    {
        LOG_ERROR_MESSAGE("Only staging textures can be mapped in OpenGL");
        MappedData = MappedTextureSubresource{};
    }
}